

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

ssize_t __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::write
          (SplitBranchNode *this,int __fd,void *__buf,size_t __n)

{
  int32_t firstRight;
  Node *this_00;
  int32_t lastRight;
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  StringTrieBuilder *builder;
  StringTrieBuilder *builder_local;
  SplitBranchNode *this_local;
  
  builder = (StringTrieBuilder *)CONCAT44(in_register_00000034,__fd);
  this_00 = this->lessThan;
  firstRight = (this->super_BranchNode).firstEdgeNumber;
  lastRight = Node::getOffset(this->greaterOrEqual);
  Node::writeUnlessInsideRightEdge(this_00,firstRight,lastRight,builder);
  (*(this->greaterOrEqual->super_UObject)._vptr_UObject[5])(this->greaterOrEqual,builder);
  uVar1 = Node::getOffset(this->lessThan);
  (*(builder->super_UObject)._vptr_UObject[0x13])(builder,(ulong)uVar1);
  iVar2 = (*(builder->super_UObject)._vptr_UObject[0xf])
                    (builder,(ulong)*(ushort *)&(this->super_BranchNode).field_0x14);
  (this->super_BranchNode).super_Node.offset = iVar2;
  return (ssize_t)this;
}

Assistant:

void
StringTrieBuilder::SplitBranchNode::write(StringTrieBuilder &builder) {
    // Encode the less-than branch first.
    lessThan->writeUnlessInsideRightEdge(firstEdgeNumber, greaterOrEqual->getOffset(), builder);
    // Encode the greater-or-equal branch last because we do not jump for it at all.
    greaterOrEqual->write(builder);
    // Write this node.
    U_ASSERT(lessThan->getOffset()>0);
    builder.writeDeltaTo(lessThan->getOffset());  // less-than
    offset=builder.write(unit);
}